

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_primitive_types.h
# Opt level: O1

duk_ret_t dukglue::types::DukType<std::shared_ptr<DogPrimitive>_>::shared_ptr_finalizer
                    (duk_context *ctx)

{
  void *pvVar1;
  
  duk_get_prop_string(ctx,0,anon_var_dwarf_3e43a);
  pvVar1 = duk_require_pointer(ctx,-1);
  duk_pop(ctx);
  if (pvVar1 != (void *)0x0) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar1 + 8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar1 + 8));
    }
    operator_delete(pvVar1,0x10);
    duk_push_undefined(ctx);
    duk_put_prop_string(ctx,0,anon_var_dwarf_3e43a);
  }
  return 0;
}

Assistant:

static duk_ret_t shared_ptr_finalizer(duk_context* ctx)
			{
				duk_get_prop_string(ctx, 0, "\xFF" "shared_ptr");
				std::shared_ptr<T>* ptr = (std::shared_ptr<T>*) duk_require_pointer(ctx, -1);
				duk_pop(ctx);  // pop shared_ptr ptr

				if (ptr != NULL) {
					delete ptr;

					// for safety, set the pointer to undefined
					// (finalizers can run multiple times)
					duk_push_undefined(ctx);
					duk_put_prop_string(ctx, 0, "\xFF" "shared_ptr");
				}

				return 0;
			}